

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqdebug.cpp
# Opt level: O3

void __thiscall
SQVM::Raise_ParamTypeError(SQVM *this,SQInteger nparam,SQInteger typemask,SQInteger type)

{
  SQUnsignedInteger *pSVar1;
  SQSharedState *ss;
  SQChar *pSVar2;
  long lVar3;
  ulong uVar4;
  SQObjectPtr exptypes;
  SQObjectPtr local_68;
  SQObjectPtr local_58;
  SQInteger local_48;
  SQInteger local_40;
  ulong local_38;
  
  local_48 = nparam;
  local_40 = type;
  local_38 = typemask;
  local_58.super_SQObject._unVal.pString = SQString::Create(this->_sharedstate,"",-1);
  local_58.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_58.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  lVar3 = 0;
  uVar4 = 0;
  do {
    if ((local_38 >> (uVar4 & 0x3f) & 1) != 0) {
      if (0 < lVar3) {
        local_68.super_SQObject._unVal.pString = SQString::Create(this->_sharedstate,"|",-1);
        local_68.super_SQObject._type = OT_STRING;
        pSVar1 = &((local_68.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
        StringCat(this,&local_58,&local_68,&local_58);
        SQObjectPtr::~SQObjectPtr(&local_68);
      }
      ss = this->_sharedstate;
      pSVar2 = IdType2Name((SQObjectType)(1L << ((byte)uVar4 & 0x3f)));
      local_68.super_SQObject._unVal.pString = SQString::Create(ss,pSVar2,-1);
      local_68.super_SQObject._type = OT_STRING;
      pSVar1 = &((local_68.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
      StringCat(this,&local_58,&local_68,&local_58);
      lVar3 = lVar3 + 1;
      SQObjectPtr::~SQObjectPtr(&local_68);
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x10);
  pSVar2 = IdType2Name((SQObjectType)local_40);
  Raise_Error(this,"parameter %d has an invalid type \'%s\' ; expected: \'%s\'",local_48,pSVar2,
              &(local_58.super_SQObject._unVal.pTable)->_firstfree);
  SQObjectPtr::~SQObjectPtr(&local_58);
  return;
}

Assistant:

void SQVM::Raise_ParamTypeError(SQInteger nparam,SQInteger typemask,SQInteger type)
{
    SQObjectPtr exptypes = SQString::Create(_ss(this), _SC(""), -1);
    SQInteger found = 0;
    for(SQInteger i=0; i<16; i++)
    {
        SQInteger mask = ((SQInteger)1) << i;
        if(typemask & (mask)) {
            if(found>0) StringCat(exptypes,SQString::Create(_ss(this), _SC("|"), -1), exptypes);
            found ++;
            StringCat(exptypes,SQString::Create(_ss(this), IdType2Name((SQObjectType)mask), -1), exptypes);
        }
    }
    Raise_Error(_SC("parameter %d has an invalid type '%s' ; expected: '%s'"), nparam, IdType2Name((SQObjectType)type), _stringval(exptypes));
}